

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O2

hypercube_t<char> *
hypercubify<char>(hypercube_t<char> *__return_storage_ptr__,rect_t<char> *in,size_t N)

{
  cube_t<char> local_30;
  
  local_30.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2e;
  make<4ul,char>(__return_storage_ptr__,N,(char *)&local_30);
  cubify<char>(&local_30,in,N);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::_M_move_assign((__return_storage_ptr__->
                   super__Vector_base<std::vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + (N >> 1),&local_30);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

hypercube_t<T> hypercubify(const rect_t<T>& in, size_t N) {
  auto hcube = make<4>(N, '.');
  hcube[N/2] = cubify<T>(in, N);
  return hcube;
}